

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateWindowingOverlay(void)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow **ppIVar3;
  char *pcVar4;
  char *label;
  ImGuiWindow *window;
  int n;
  ImVec2 *in_stack_00000058;
  ImGuiSelectableFlags in_stack_00000060;
  bool in_stack_00000067;
  char *in_stack_00000068;
  ImGuiViewport *viewport;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000384;
  bool *in_stack_00000388;
  char *in_stack_00000390;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  char *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  char *text;
  ImVec2 *this;
  int count;
  ImVec2 *pIVar5;
  ImVec2 *in_stack_ffffffffffffffa0;
  ImVec2 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  ImGuiStyleVar idx;
  int local_3c;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiViewport *local_10;
  ImGuiContext *local_8;
  
  idx = (ImGuiStyleVar)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  local_8 = GImGui;
  if (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      pIVar2 = FindWindowByName(in_stack_ffffffffffffff80);
      local_8->NavWindowingListWindow = pIVar2;
    }
    local_10 = GetMainViewport();
    this = &local_18;
    ImVec2::ImVec2(this,(local_10->Size).x * 0.2,(local_10->Size).y * 0.2);
    pIVar5 = &local_20;
    ImVec2::ImVec2(pIVar5,3.4028235e+38,3.4028235e+38);
    SetNextWindowSizeConstraints
              (in_stack_ffffffffffffffa0,pIVar5,(ImGuiSizeCallback)this,in_stack_ffffffffffffff88);
    local_28 = ImGuiViewport::GetCenter
                         ((ImGuiViewport *)
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    pIVar5 = &local_30;
    ImVec2::ImVec2(pIVar5,0.5,0.5);
    SetNextWindowPos(&local_28,1,pIVar5);
    operator*((ImVec2 *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),0.0);
    PushStyleVar(idx,(ImVec2 *)in_stack_ffffffffffffffa8);
    Begin(in_stack_00000390,in_stack_00000388,in_stack_00000384);
    local_3c = (local_8->WindowsFocusOrder).Size;
    while( true ) {
      count = (int)((ulong)this >> 0x20);
      local_3c = local_3c + -1;
      if (local_3c < 0) break;
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&local_8->WindowsFocusOrder,local_3c);
      pIVar2 = *ppIVar3;
      bVar1 = IsWindowNavFocusable(pIVar2);
      if (bVar1) {
        text = pIVar2->Name;
        pcVar4 = FindRenderedTextEnd(text,(char *)0x0);
        if (text == pcVar4) {
          GetFallbackWindowNameForWindowingList
                    ((ImGuiWindow *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        }
        in_stack_ffffffffffffff7f = local_8->NavWindowingTarget == pIVar2;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa8,0.0,0.0);
        Selectable(in_stack_00000068,in_stack_00000067,in_stack_00000060,in_stack_00000058);
      }
    }
    End();
    PopStyleVar(count);
  }
  return;
}

Assistant:

void ImGui::NavUpdateWindowingOverlay()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget != NULL);

    if (g.NavWindowingTimer < NAV_WINDOWING_LIST_APPEAR_DELAY)
        return;

    if (g.NavWindowingListWindow == NULL)
        g.NavWindowingListWindow = FindWindowByName("###NavWindowingList");
    const ImGuiViewport* viewport = GetMainViewport();
    SetNextWindowSizeConstraints(ImVec2(viewport->Size.x * 0.20f, viewport->Size.y * 0.20f), ImVec2(FLT_MAX, FLT_MAX));
    SetNextWindowPos(viewport->GetCenter(), ImGuiCond_Always, ImVec2(0.5f, 0.5f));
    PushStyleVar(ImGuiStyleVar_WindowPadding, g.Style.WindowPadding * 2.0f);
    Begin("###NavWindowingList", NULL, ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoInputs | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoSavedSettings);
    for (int n = g.WindowsFocusOrder.Size - 1; n >= 0; n--)
    {
        ImGuiWindow* window = g.WindowsFocusOrder[n];
        IM_ASSERT(window != NULL); // Fix static analyzers
        if (!IsWindowNavFocusable(window))
            continue;
        const char* label = window->Name;
        if (label == FindRenderedTextEnd(label))
            label = GetFallbackWindowNameForWindowingList(window);
        Selectable(label, g.NavWindowingTarget == window);
    }
    End();
    PopStyleVar();
}